

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O1

int ffmkys(fitsfile *fptr,char *keyname,char *value,char *comm,int *status)

{
  FITSfile *pFVar1;
  undefined1 auVar2 [16];
  int iVar3;
  size_t sVar4;
  char *comm_00;
  char valstring [71];
  char nextcomm [73];
  char oldval [71];
  char oldcomm [73];
  char card [81];
  undefined8 uStack_1d0;
  char local_1c8 [80];
  char local_178 [80];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  uStack_1d0 = 0x18e8b9;
  iVar3 = ffgkey(fptr,keyname,local_128,local_d8,status);
  if (iVar3 < 1) {
    uStack_1d0 = 0x18e8cf;
    ffs2c(value,local_1c8,status);
    comm_00 = local_d8;
    if ((comm != (char *)0x0) && (comm_00 = local_d8, *comm != '&')) {
      comm_00 = comm;
    }
    uStack_1d0 = 0x18e901;
    ffmkky(keyname,local_1c8,comm_00,local_88,status);
    uStack_1d0 = 0x18e90f;
    ffmkey(fptr,local_88,status);
    pFVar1 = fptr->Fptr;
    auVar2 = SEXT816(pFVar1->nextkey - pFVar1->headstart[pFVar1->curhdu]) *
             SEXT816(0x6666666666666667);
    if (0 < *status) {
      return *status;
    }
    uStack_1d0 = 0x18e953;
    ffpmrk();
    uStack_1d0 = 0x18e966;
    ffc2s(local_128,local_1c8,status);
    if (*status == 0xcc) {
      uStack_1d0 = 0x18e973;
      ffcmrk();
      *status = 0;
    }
    else {
      uStack_1d0 = 0x18e989;
      sVar4 = strlen(local_1c8);
      if ((int)sVar4 != 0) {
        do {
          if (local_1c8[(long)(int)sVar4 + -1] != '&') break;
          local_178[0] = '\0';
          uStack_1d0 = 0x18e9cb;
          ffgcnt(fptr,local_1c8,local_178,status);
          sVar4 = 0;
          if (local_178[0] != '\0' || local_1c8[0] != '\0') {
            uStack_1d0 = 0x18e9e3;
            ffdrec(fptr,((int)(auVar2._8_8_ >> 5) - (auVar2._12_4_ >> 0x1f)) + 1,status);
            uStack_1d0 = 0x18e9eb;
            sVar4 = strlen(local_1c8);
          }
        } while ((int)sVar4 != 0);
      }
    }
  }
  return *status;
}

Assistant:

int ffmkys(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           const char *value,       /* I - keyword value      */
           const char *comm,        /* I - keyword comment    */
           int *status)             /* IO - error status      */
{
  /* NOTE: This routine does not support long continued strings */
  /*  It will correctly overwrite an existing long continued string, */
  /*  but it will not write a new long string.  */

    char oldval[FLEN_VALUE], valstring[FLEN_VALUE];
    char oldcomm[FLEN_COMMENT];
    char card[FLEN_CARD], nextcomm[FLEN_COMMENT];
    int len, keypos;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, oldval, oldcomm, status) > 0)
        return(*status);                               /* get old comment */

    ffs2c(value, valstring, status);   /* convert value to a string */

    if (!comm || comm[0] == '&')  /* preserve the current comment string */
        ffmkky(keyname, valstring, oldcomm, card, status);
    else
        ffmkky(keyname, valstring, comm, card, status);

    ffmkey(fptr, card, status); /* overwrite the previous keyword */

    keypos = (int) (((((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])) / 80) + 1);

    if (*status > 0)           
        return(*status);

    /* check if old string value was continued over multiple keywords */
    ffpmrk(); /* put mark on message stack; erase any messages after this */
    ffc2s(oldval, valstring, status); /* remove quotes and trailing spaces */

    if (*status == VALUE_UNDEFINED) {
       ffcmrk();  /* clear any spurious error messages, back to the mark */
       *status = 0;
    } else {
        
      len = strlen(valstring);

      while (len && valstring[len - 1] == '&')  /* ampersand is continuation char */
      {
        nextcomm[0]='\0';
        ffgcnt(fptr, valstring, nextcomm, status);
        if (*valstring || strlen(nextcomm))
        {
            ffdrec(fptr, keypos, status);  /* delete the continuation */
            len = strlen(valstring);
        }
        else   /* a null valstring indicates no continuation */
            len = 0;
      }
    }

    return(*status);
}